

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

type __thiscall
chrono::ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor>::
_archive_in_constructor<myEmployeeCustomConstructor>
          (ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor> *this,ChArchiveIn *marchive,
          char *classname)

{
  char *pcVar1;
  bool bVar2;
  myEmployeeCustomConstructor *pmVar3;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *classname_local;
  ChArchiveIn *marchive_local;
  ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor> *this_local;
  
  local_20 = classname;
  classname_local = (char *)marchive;
  marchive_local = (ChArchiveIn *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,classname,&local_41);
  bVar2 = ChClassFactory::IsClassRegistered(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
    ChClassFactory::create<myEmployeeCustomConstructor>
              (&local_78,(ChArchiveIn *)classname_local,this->pt2Object);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else {
    pmVar3 = (myEmployeeCustomConstructor *)
             myEmployeeCustomConstructor::ArchiveINconstructor((ChArchiveIn *)classname_local);
    *this->pt2Object = pmVar3;
  }
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveINconstructor<Tc>::value, void >::type
        _archive_in_constructor(ChArchiveIn& marchive, const char* classname) {
            if (ChClassFactory::IsClassRegistered(std::string(classname)))
                ChClassFactory::create(std::string(classname), marchive, pt2Object);
            else
                *pt2Object = static_cast<Tc*> (Tc::ArchiveINconstructor(marchive));
        }